

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall
rlottie::internal::renderer::Paint::renderList
          (Paint *this,vector<VDrawable_*,_std::allocator<VDrawable_*>_> *list)

{
  vector<VDrawable_*,_std::allocator<VDrawable_*>_> *in_RDI;
  Paint *in_stack_00000030;
  value_type *in_stack_ffffffffffffffd8;
  
  if (((ulong)in_RDI[4].super__Vector_base<VDrawable_*,_std::allocator<VDrawable_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage & 0x10000000000) != 0) {
    updateRenderNode(in_stack_00000030);
    *(undefined1 *)
     ((long)&in_RDI[4].super__Vector_base<VDrawable_*,_std::allocator<VDrawable_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 5) = 0;
  }
  if (((ulong)in_RDI[4].super__Vector_base<VDrawable_*,_std::allocator<VDrawable_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage & 0x1000000000000) != 0) {
    std::vector<VDrawable_*,_std::allocator<VDrawable_*>_>::push_back
              (in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void renderer::Paint::renderList(std::vector<VDrawable *> &list)
{
    if (mRenderNodeUpdate) {
        updateRenderNode();
        mRenderNodeUpdate = false;
    }

    // Q: Why we even update the final path if we don't have content
    // to render ?
    // Ans: We update the render nodes because we will loose the
    // dirty path information at end of this frame.
    // so if we return early without updating the final path.
    // in the subsequent frame when we have content to render but
    // we may not able to update our final path properly as we
    // don't know what paths got changed in between.
    if (mContentToRender) list.push_back(&mDrawable);
}